

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O2

parser_error parse_graf_extra(parser *p)

{
  uint uVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    uVar1 = parser_getuint(p,"alpha");
    *(char *)((long)pvVar3 + 9) = (char)uVar1;
    uVar1 = parser_getuint(p,"row");
    *(char *)((long)pvVar3 + 10) = (char)uVar1;
    uVar1 = parser_getuint(p,"max");
    *(char *)((long)pvVar3 + 0xb) = (char)uVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_graf_extra(struct parser *p) {
	graphics_mode *mode = parser_priv(p);
	if (!mode) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	mode->alphablend = parser_getuint(p, "alpha");
	mode->overdrawRow = parser_getuint(p, "row");
	mode->overdrawMax = parser_getuint(p, "max");
	return PARSE_ERROR_NONE;
}